

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void Imf_2_5::(anonymous_namespace)::checkIsNullTerminated<256ul>(char (*str) [256],char *what)

{
  char *pcVar1;
  size_t i;
  long lVar2;
  ostream *poVar3;
  InputExc *this;
  stringstream s;
  ostream local_180 [376];
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x100) {
      std::__cxx11::stringstream::stringstream((stringstream *)&s);
      poVar3 = std::operator<<(local_180,"Invalid ");
      poVar3 = std::operator<<(poVar3,what);
      poVar3 = std::operator<<(poVar3,": it is more than ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," characters long.");
      this = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(this,(stringstream *)&s);
      __cxa_throw(this,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    pcVar1 = *str + lVar2;
    lVar2 = lVar2 + 1;
  } while (*pcVar1 != '\0');
  return;
}

Assistant:

void checkIsNullTerminated (const char (&str)[N], const char *what)
{
	for (size_t i = 0; i < N; ++i) {
		if (str[i] == '\0')
			return;
	}
	std::stringstream s;
	s << "Invalid " << what << ": it is more than " << (N - 1) 
		<< " characters long.";
	throw IEX_NAMESPACE::InputExc(s);
}